

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O1

void Imf_3_4::hufUncompress(char *compressed,int nCompressed,unsigned_short *raw,int nRaw)

{
  unsigned_short *puVar1;
  unsigned_short uVar2;
  uint maxSymbol;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint64_t *hcode;
  void *__s;
  void *pvVar7;
  void *pvVar8;
  InputExc *pIVar9;
  sbyte sVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  byte *pbVar15;
  unsigned_short *puVar16;
  byte *pbVar17;
  ulong uVar18;
  long lVar19;
  int *piVar20;
  uint *puVar21;
  uint uVar22;
  uint uVar23;
  uchar *b;
  ulong uVar24;
  char *ptr;
  FastHufDecoder fhd;
  byte *local_5420;
  ulong local_5418;
  ulong local_5410;
  byte *local_5408;
  FastHufDecoder local_5400;
  
  if (nCompressed < 0x14) {
    if (nRaw == 0) {
      return;
    }
  }
  else {
    uVar4 = *(uint *)compressed;
    if ((0x10000 < uVar4) || (maxSymbol = *(uint *)(compressed + 4), 0x10000 < maxSymbol))
    goto LAB_0017f1d2;
    local_5410 = (ulong)(byte)compressed[0xc];
    uVar13 = (long)(int)((uint)(byte)compressed[0xf] << 0x18 |
                        (uint)(byte)compressed[0xe] << 0x10 | (uint)(byte)compressed[0xd] << 8) |
             local_5410;
    local_5420 = (byte *)(compressed + 0x14);
    uVar24 = uVar13 + 7 >> 3;
    local_5408 = (byte *)(ulong)(uint)nCompressed + (long)compressed;
    if (compressed + uVar24 + 0x14 <= local_5408) {
      bVar3 = FastHufDecoder::enabled();
      local_5418 = uVar13;
      if (0x80 < (int)uVar13 && bVar3) {
        FastHufDecoder::FastHufDecoder
                  (&local_5400,(char **)&local_5420,
                   ((int)compressed - (int)local_5420) + nCompressed,uVar4,maxSymbol,maxSymbol);
        if (local_5420 + (uVar24 - (long)compressed) <= (byte *)(ulong)(uint)nCompressed) {
          FastHufDecoder::decode(&local_5400,local_5420,(int)local_5418,raw,nRaw);
          FastHufDecoder::~FastHufDecoder(&local_5400);
          return;
        }
        anon_unknown_0::notEnoughData();
LAB_0017f209:
        pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc
                  (pIVar9,"Error in header for Huffman-encoded data (invalid number of bits).");
        __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      hcode = (uint64_t *)operator_new__(0x80008);
      memset(hcode,0,0x80008);
      __s = operator_new__(0x40000);
      iVar14 = 0;
      memset(__s,0,0x40000);
      pbVar15 = local_5420;
      memset(hcode,0,0x80008);
      pbVar17 = pbVar15;
      if ((int)uVar4 <= (int)maxSymbol) {
        lVar19 = (long)(((int)compressed - (int)pbVar15) + nCompressed);
        uVar13 = 0;
        uVar22 = uVar4;
        do {
          if (lVar19 < (long)pbVar17 - (long)pbVar15) goto LAB_0017f1c3;
          iVar6 = iVar14;
          if (iVar14 < 6) {
            do {
              bVar11 = *pbVar17;
              pbVar17 = pbVar17 + 1;
              uVar13 = uVar13 << 8 | (ulong)bVar11;
              iVar6 = iVar14 + 8;
              bVar3 = iVar14 < -2;
              iVar14 = iVar6;
            } while (bVar3);
          }
          iVar14 = iVar6 + -6;
          uVar12 = (uint)(uVar13 >> ((byte)iVar14 & 0x3f)) & 0x3f;
          hcode[(int)uVar22] = (ulong)uVar12;
          if ((ulong)uVar12 == 0x3f) {
            if (lVar19 < (long)pbVar17 - (long)pbVar15) goto LAB_0017f1c3;
            if (iVar6 < 0xe) {
              iVar6 = iVar6 + -0xe;
              do {
                iVar14 = iVar6;
                bVar11 = *pbVar17;
                pbVar17 = pbVar17 + 1;
                uVar13 = (ulong)bVar11 | uVar13 << 8;
                iVar6 = iVar14 + 8;
              } while (iVar6 < 0);
              iVar14 = iVar14 + 0x10;
            }
            iVar14 = iVar14 + -8;
            uVar24 = uVar13 >> ((byte)iVar14 & 0x3f);
            if ((int)(maxSymbol + 1) < (int)(((uint)uVar24 & 0xff) + uVar22 + 6)) goto LAB_0017f1c8;
            uVar24 = uVar24 & 0xff;
            memset(hcode + (int)uVar22,0,uVar24 * 8 + 0x30);
            uVar23 = uVar22 + (int)uVar24 + 5;
          }
          else {
            uVar23 = uVar22;
            if (0x3a < uVar12) {
              if ((int)(maxSymbol + 1) < (int)(uVar12 + uVar22 + -0x39)) goto LAB_0017f1c8;
              if (uVar12 - 0x39 != 0) {
                memset(hcode + (int)uVar22,0,(ulong)(uVar12 - 0x39) << 3);
                uVar22 = (uVar22 + uVar12) - 0x39;
              }
              uVar23 = uVar22 - 1;
            }
          }
          uVar22 = uVar23 + 1;
        } while ((int)uVar23 < (int)maxSymbol);
      }
      local_5420 = pbVar17;
      anon_unknown_0::hufCanonicalCodeTable(hcode);
      if (((long)local_5408 - (long)pbVar17) * 8 < (long)local_5418) goto LAB_0017f209;
      if ((int)uVar4 <= (int)maxSymbol) {
        uVar13 = (ulong)uVar4;
        do {
          uVar24 = hcode[uVar13];
          uVar18 = uVar24 >> 6;
          uVar4 = (uint)uVar24 & 0x3f;
          sVar10 = (sbyte)uVar4;
          if (uVar18 >> sVar10 != 0) goto LAB_0017f1af;
          if (uVar4 < 0xf) {
            if ((uVar24 & 0x3f) != 0) {
              uVar24 = (ulong)(uint)(1 << (0xeU - sVar10 & 0x1f));
              puVar21 = (uint *)((uVar18 << (0xeU - sVar10 & 0x3f)) * 0x10 + (long)__s);
              do {
                if (((char)*puVar21 != '\0') || (*(long *)(puVar21 + 2) != 0)) goto LAB_0017f1af;
                *puVar21 = (int)uVar13 << 8 | uVar4;
                puVar21 = puVar21 + 4;
                uVar24 = uVar24 - 1;
              } while (uVar24 != 0);
            }
          }
          else {
            lVar19 = (uVar18 >> (sVar10 - 0xeU & 0x3f)) * 0x10;
            iVar14 = *(int *)((long)__s + lVar19);
            if ((char)iVar14 != '\0') goto LAB_0017f1af;
            piVar20 = (int *)(lVar19 + (long)__s);
            iVar14 = iVar14 + 0x100;
            *piVar20 = iVar14;
            pvVar8 = *(void **)(piVar20 + 2);
            if (pvVar8 == (void *)0x0) {
              pvVar8 = operator_new__(4);
              *(void **)(piVar20 + 2) = pvVar8;
            }
            else {
              iVar14 = iVar14 >> 8;
              uVar24 = (long)iVar14 * 4;
              if (iVar14 < 0) {
                uVar24 = 0xffffffffffffffff;
              }
              pvVar7 = operator_new__(uVar24);
              *(void **)(piVar20 + 2) = pvVar7;
              if (1 < iVar14) {
                uVar24 = 0;
                do {
                  *(undefined4 *)((long)pvVar7 + uVar24 * 4) =
                       *(undefined4 *)((long)pvVar8 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (iVar14 - 1 != uVar24);
              }
              operator_delete__(pvVar8);
            }
            *(int *)(*(long *)(piVar20 + 2) + -4 + (long)(*piVar20 >> 8) * 4) = (int)uVar13;
          }
          uVar13 = uVar13 + 1;
        } while (maxSymbol + 1 != (int)uVar13);
      }
      puVar1 = raw + nRaw;
      iVar14 = (int)local_5418;
      iVar6 = iVar14 + 0xe;
      if (-1 < iVar14 + 7) {
        iVar6 = iVar14 + 7;
      }
      pbVar15 = local_5420;
      puVar16 = raw;
      if (iVar14 < 1) {
        iVar14 = 0;
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        iVar14 = 0;
        do {
          bVar11 = *pbVar15;
          pbVar15 = pbVar15 + 1;
          uVar13 = (ulong)bVar11 | uVar13 << 8;
          iVar5 = iVar14 + 8;
          bVar3 = 5 < iVar14;
          iVar14 = iVar5;
          if (bVar3) {
            do {
              uVar24 = (ulong)(((uint)(uVar13 >> ((char)iVar14 - 0xeU & 0x3f)) & 0x3fff) << 4);
              iVar5 = *(int *)((long)__s + uVar24);
              uVar4 = iVar5 >> 8;
              if (iVar5 << 0x18 == 0) {
                lVar19 = *(long *)((long)__s + uVar24 + 8);
                if (lVar19 == 0) goto LAB_0017f1a5;
                if ((int)uVar4 < 1) {
                  uVar24 = 0;
                }
                else {
                  uVar24 = 0;
                  do {
                    uVar22 = *(uint *)(lVar19 + uVar24 * 4);
                    uVar12 = (uint)hcode[(int)uVar22] & 0x3f;
                    for (; (iVar14 < (int)uVar12 && (pbVar15 < local_5420 + (iVar6 >> 3)));
                        pbVar15 = pbVar15 + 1) {
                      uVar13 = (ulong)*pbVar15 | uVar13 << 8;
                      iVar14 = iVar14 + 8;
                    }
                    bVar3 = true;
                    if (((int)uVar12 <= iVar14) &&
                       (iVar5 = iVar14 - uVar12,
                       hcode[(int)uVar22] >> 6 ==
                       (~(-1L << (sbyte)uVar12) & uVar13 >> ((byte)iVar5 & 0x3f)))) {
                      if (uVar22 == maxSymbol) {
                        if (iVar5 < 8) {
                          bVar11 = *pbVar15;
                          pbVar15 = pbVar15 + 1;
                          uVar13 = uVar13 << 8 | (ulong)bVar11;
                          iVar5 = iVar5 + 8;
                        }
                        iVar14 = iVar5 + -8;
                        uVar18 = uVar13 >> ((byte)iVar14 & 0x3f);
                        if (puVar1 < puVar16 + (uVar18 & 0xff)) goto LAB_0017f19b;
                        if (puVar16 + -1 < raw) goto LAB_0017f1b9;
                        if ((char)uVar18 == '\0') {
                          bVar3 = false;
                        }
                        else {
                          uVar2 = puVar16[-1];
                          do {
                            *puVar16 = uVar2;
                            puVar16 = puVar16 + 1;
                            bVar11 = (char)uVar18 - 1;
                            uVar18 = (ulong)bVar11;
                          } while (bVar11 != 0);
                          bVar3 = false;
                        }
                      }
                      else {
                        if (puVar1 <= puVar16) goto LAB_0017f19b;
                        *puVar16 = (unsigned_short)uVar22;
                        puVar16 = puVar16 + 1;
                        bVar3 = false;
                        iVar14 = iVar5;
                      }
                    }
                    if (!bVar3) goto LAB_0017f054;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != uVar4);
                  uVar24 = (ulong)uVar4;
                }
LAB_0017f054:
                if ((uint)uVar24 == uVar4) goto LAB_0017f1a5;
              }
              else {
                iVar14 = iVar14 - ((iVar5 << 0x18) >> 0x18);
                if (iVar14 < 0) goto LAB_0017f1a5;
                if (uVar4 == maxSymbol) {
                  if (iVar14 < 8) {
                    bVar11 = *pbVar15;
                    pbVar15 = pbVar15 + 1;
                    uVar13 = uVar13 << 8 | (ulong)bVar11;
                    iVar14 = iVar14 + 8;
                  }
                  iVar14 = iVar14 + -8;
                  uVar24 = uVar13 >> ((byte)iVar14 & 0x3f);
                  if (puVar1 < puVar16 + (uVar24 & 0xff)) goto LAB_0017f19b;
                  if (puVar16 + -1 < raw) goto LAB_0017f1b9;
                  if ((char)uVar24 != '\0') {
                    uVar2 = puVar16[-1];
                    do {
                      *puVar16 = uVar2;
                      puVar16 = puVar16 + 1;
                      bVar11 = (char)uVar24 - 1;
                      uVar24 = (ulong)bVar11;
                    } while (bVar11 != 0);
                  }
                }
                else {
                  if (puVar1 <= puVar16) goto LAB_0017f19b;
                  *puVar16 = (unsigned_short)((uint)iVar5 >> 8);
                  puVar16 = puVar16 + 1;
                }
              }
            } while (0xd < iVar14);
          }
        } while (pbVar15 < local_5420 + (iVar6 >> 3));
      }
      uVar4 = -(int)local_5410 & 7;
      iVar6 = iVar14 - uVar4;
      if (iVar6 != 0 && (int)uVar4 <= iVar14) {
        uVar13 = uVar13 >> (sbyte)uVar4;
        do {
          iVar14 = *(int *)((long)__s +
                           (ulong)(((uint)(uVar13 << (0xeU - (char)iVar6 & 0x3f)) & 0x3fff) << 4));
          if ((iVar14 << 0x18 == 0) || (iVar6 = iVar6 - ((iVar14 << 0x18) >> 0x18), iVar6 < 0))
          goto LAB_0017f1a5;
          if (iVar14 >> 8 == maxSymbol) {
            if (iVar6 < 8) {
              bVar11 = *pbVar15;
              pbVar15 = pbVar15 + 1;
              uVar13 = uVar13 << 8 | (ulong)bVar11;
              iVar6 = iVar6 + 8;
            }
            iVar6 = iVar6 + -8;
            uVar24 = uVar13 >> ((byte)iVar6 & 0x3f);
            if (puVar1 < puVar16 + (uVar24 & 0xff)) goto LAB_0017f19b;
            if (puVar16 + -1 < raw) goto LAB_0017f1b9;
            if ((char)uVar24 != '\0') {
              uVar2 = puVar16[-1];
              do {
                *puVar16 = uVar2;
                puVar16 = puVar16 + 1;
                bVar11 = (char)uVar24 - 1;
                uVar24 = (ulong)bVar11;
              } while (bVar11 != 0);
            }
          }
          else {
            if (puVar1 <= puVar16) goto LAB_0017f19b;
            *puVar16 = (unsigned_short)((uint)iVar14 >> 8);
            puVar16 = puVar16 + 1;
          }
        } while (0 < iVar6);
      }
      if ((long)puVar16 - (long)raw >> 1 == (long)nRaw) {
        lVar19 = 8;
        do {
          if (*(void **)((long)__s + lVar19) != (void *)0x0) {
            operator_delete__(*(void **)((long)__s + lVar19));
            *(undefined8 *)((long)__s + lVar19) = 0;
          }
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x40008);
        operator_delete__(__s);
        operator_delete__(hcode);
        return;
      }
      goto LAB_0017f1b9;
    }
  }
  goto LAB_0017f1cd;
LAB_0017f19b:
  anon_unknown_0::tooMuchData();
LAB_0017f1a5:
  anon_unknown_0::invalidCode();
LAB_0017f1af:
  anon_unknown_0::invalidTableEntry();
LAB_0017f1b9:
  anon_unknown_0::notEnoughData();
LAB_0017f1c3:
  anon_unknown_0::unexpectedEndOfTable();
LAB_0017f1c8:
  anon_unknown_0::tableTooLong();
LAB_0017f1cd:
  anon_unknown_0::notEnoughData();
LAB_0017f1d2:
  pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(pIVar9,"Error in Huffman-encoded data (invalid code table size).");
  __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

void
hufUncompress (
    const char compressed[], int nCompressed, unsigned short raw[], int nRaw)
{
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) notEnoughData ();

        return;
    }

    int im = readUInt (compressed);
    int iM = readUInt (compressed + 4);
    // int tableLength = readUInt (compressed + 8);
    int nBits = readUInt (compressed + 12);

    if (im < 0 || im >= HUF_ENCSIZE || iM < 0 || iM >= HUF_ENCSIZE)
        invalidTableSize ();

    const char* ptr = compressed + 20;

    uint64_t nBytes = (static_cast<uint64_t> (nBits) + 7) / 8;

    if (ptr + nBytes > compressed + nCompressed)
    {
        notEnoughData ();
        return;
    }

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //

    if (FastHufDecoder::enabled () && nBits > 128)
    {
        FastHufDecoder fhd (ptr, nCompressed - (ptr - compressed), im, iM, iM);

        // must be nBytes remaining in buffer
        if (ptr - compressed + nBytes > static_cast<uint64_t> (nCompressed))
        {
            notEnoughData ();
            return;
        }

        fhd.decode ((unsigned char*) ptr, nBits, raw, nRaw);
    }
    else
    {
        AutoArray<uint64_t, HUF_ENCSIZE> freq;
        AutoArray<HufDec, HUF_DECSIZE>   hdec;

        hufClearDecTable (hdec);

        hufUnpackEncTable (
            &ptr, nCompressed - (ptr - compressed), im, iM, freq);

        try
        {
            if (nBits > 8 * (nCompressed - (ptr - compressed))) invalidNBits ();

            hufBuildDecTable (freq, im, iM, hdec);
            hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);
        }
        catch (...)
        {
            hufFreeDecTable (hdec);
            throw;
        }

        hufFreeDecTable (hdec);
    }
}